

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O2

void __thiscall
TTD::ExecutionInfoManager::ClearActiveBPInfo
          (ExecutionInfoManager *this,ThreadContextTTD *ttdThreadContext)

{
  TTD_LOG_PTR_ID ctxId;
  StatementLocation statement_00;
  bool bVar1;
  ScriptContext *inCtx;
  FunctionBody *pFVar2;
  DebugDocument *this_00;
  undefined1 auStack_30 [8];
  StatementLocation statement;
  
  ctxId = (this->m_activeTTDBP).m_sourceScriptLogId;
  if (ctxId != 0) {
    inCtx = ThreadContextTTD::LookupContextForScriptId(ttdThreadContext,ctxId);
    pFVar2 = TTDebuggerSourceLocation::LoadFunctionBodyIfPossible(&this->m_activeTTDBP,inCtx);
    this_00 = Js::Utf8SourceInfo::GetDebugDocument
                        ((pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.
                         ptr);
    statement.function = (FunctionBody *)0x0;
    statement.statement.begin = 0;
    statement.statement.end = 0;
    if (this->m_shouldRemoveWhenDone == true) {
      bVar1 = Js::DebugDocument::FindBPStatementLocation
                        (this_00,(UINT)this->m_activeBPId,(StatementLocation *)auStack_30);
      if (bVar1) {
        statement_00.statement = (Interval)statement.function;
        statement_00.function = (FunctionBody *)auStack_30;
        statement_00.bytecodeSpan = statement.statement;
        Js::DebugDocument::SetBreakPoint(this_00,statement_00,BREAKPOINT_DELETED);
      }
    }
    this->m_activeBPId = -1;
    this->m_shouldRemoveWhenDone = false;
    (this->m_activeTTDBP).m_sourceScriptLogId = 0;
    *(undefined4 *)&(this->m_activeTTDBP).m_bpId = 0xffffffff;
    *(undefined4 *)((long)&(this->m_activeTTDBP).m_bpId + 4) = 0xffffffff;
    *(undefined4 *)&(this->m_activeTTDBP).m_etime = 0xffffffff;
    *(undefined4 *)((long)&(this->m_activeTTDBP).m_etime + 4) = 0xffffffff;
    (this->m_activeTTDBP).m_ftime = 0;
    (this->m_activeTTDBP).m_ltime = 0;
    (this->m_activeTTDBP).m_topLevelBodyId = 0;
    (this->m_activeTTDBP).m_functionLine = 0;
    (this->m_activeTTDBP).m_functionColumn = 0;
    (this->m_activeTTDBP).m_line = 0;
    (this->m_activeTTDBP).m_column = 0;
    return;
  }
  TTDAbort_unrecoverable_error("Need to check that we actually have info to clear first.");
}

Assistant:

void ExecutionInfoManager::ClearActiveBPInfo(ThreadContextTTD* ttdThreadContext)
    {
        TTDAssert(this->m_activeTTDBP.HasValue(), "Need to check that we actually have info to clear first.");

        Js::ScriptContext* ctx = ttdThreadContext->LookupContextForScriptId(this->m_activeTTDBP.GetScriptLogTagId());
        Js::FunctionBody* body = this->m_activeTTDBP.LoadFunctionBodyIfPossible(ctx);

        Js::DebugDocument* debugDocument = body->GetUtf8SourceInfo()->GetDebugDocument();
        Js::StatementLocation statement;
        if(this->m_shouldRemoveWhenDone && debugDocument->FindBPStatementLocation((UINT)this->m_activeBPId, &statement))
        {
            debugDocument->SetBreakPoint(statement, BREAKPOINT_DELETED);
        }

        this->m_activeBPId = -1;
        this->m_shouldRemoveWhenDone = false;
        this->m_activeTTDBP.Clear();
    }